

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O1

int compare_func(void *a,void *b)

{
  ulong uVar1;
  int iVar2;
  ulong __n;
  pair *bb;
  pair *aa;
  
  uVar1 = *(ulong *)((long)a + 8);
  __n = *(ulong *)((long)b + 8);
  if (uVar1 == 0) {
    return -(uint)(__n != 0);
  }
  if (__n != 0) {
    if (uVar1 < __n) {
      __n = uVar1;
    }
    iVar2 = strncmp(*a,*b,__n);
    return iVar2;
  }
  return 1;
}

Assistant:

static int compare_func(const void *a, const void *b)
{
  const struct pair *aa = a;
  const struct pair *bb = b;
  /* If one element is empty, the other is always sorted higher */
  if(aa->len == 0 && bb->len == 0)
    return 0;
  if(aa->len == 0)
    return -1;
  if(bb->len == 0)
    return 1;
  return strncmp(aa->p, bb->p, aa->len < bb->len ? aa->len : bb->len);
}